

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O1

void xercesc_4_0::XTemplateSerializer::storeObject
               (RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher> *objToStore,
               XSerializeEngine *serEng)

{
  ushort uVar1;
  bool bVar2;
  ushort *key1;
  RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher> *__n;
  XMLSize_t XVar3;
  ushort *puVar4;
  void *__buf;
  void *extraout_RDX;
  RefHashTableBucketElem<xercesc_4_0::XMLAttDef> *pRVar5;
  int __fd;
  XMLSize_t XVar6;
  RefHashTableOfEnumerator<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher> local_60;
  
  bVar2 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar2) {
    XSerializeEngine::writeSize(serEng,objToStore->fHashModulus);
    local_60.fMemoryManager = objToStore->fMemoryManager;
    local_60.super_XMLEnumerator<xercesc_4_0::XMLAttDef>._vptr_XMLEnumerator =
         (_func_int **)&PTR__RefHashTableOfEnumerator_00413f28;
    local_60.fAdopted = false;
    local_60.fCurElem = (RefHashTableBucketElem<xercesc_4_0::XMLAttDef> *)0x0;
    local_60.fCurHash = 0;
    pRVar5 = local_60.fCurElem;
    if (objToStore->fHashModulus != 0) {
      XVar6 = 1;
      do {
        XVar3 = XVar6;
        pRVar5 = objToStore->fBucketList[XVar3 - 1];
        if (objToStore->fBucketList[XVar3 - 1] !=
            (RefHashTableBucketElem<xercesc_4_0::XMLAttDef> *)0x0) break;
        XVar6 = XVar3 + 1;
        pRVar5 = local_60.fCurElem;
        local_60.fCurHash = XVar3;
      } while (XVar3 != objToStore->fHashModulus);
    }
    local_60.fCurElem = pRVar5;
    XVar6 = 0;
    local_60.fToEnum = objToStore;
    while ((local_60.fCurElem != (RefHashTableBucketElem<xercesc_4_0::XMLAttDef> *)0x0 ||
           (local_60.fCurHash != (local_60.fToEnum)->fHashModulus))) {
      RefHashTableOfEnumerator<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher>::nextElement
                (&local_60);
      XVar6 = XVar6 + 1;
    }
    XSerializeEngine::writeSize(serEng,XVar6);
    local_60.fCurElem = (RefHashTableBucketElem<xercesc_4_0::XMLAttDef> *)0x0;
    local_60.fCurHash = 0;
    __n = local_60.fToEnum;
    pRVar5 = local_60.fCurElem;
    if ((local_60.fToEnum)->fHashModulus != 0) {
      __n = (RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher> *)
            (local_60.fToEnum)->fBucketList;
      XVar6 = 1;
      do {
        XVar3 = XVar6;
        pRVar5 = *(RefHashTableBucketElem<xercesc_4_0::XMLAttDef> **)((long)__n + XVar3 * 8 + -8);
        if (pRVar5 != (RefHashTableBucketElem<xercesc_4_0::XMLAttDef> *)0x0) break;
        XVar6 = XVar3 + 1;
        pRVar5 = local_60.fCurElem;
        local_60.fCurHash = XVar3;
      } while (XVar3 != (local_60.fToEnum)->fHashModulus);
    }
    local_60.fCurElem = pRVar5;
    while ((local_60.fCurElem != (RefHashTableBucketElem<xercesc_4_0::XMLAttDef> *)0x0 ||
           (__n = local_60.fToEnum, local_60.fCurHash != (local_60.fToEnum)->fHashModulus))) {
      key1 = (ushort *)
             RefHashTableOfEnumerator<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher>::
             nextElementKey(&local_60);
      if ((key1 == (ushort *)0x0) ||
         (__n = (RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher> *)(ulong)*key1,
         __n == (RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher> *)0x0)) {
        __buf = (void *)0x0;
      }
      else {
        uVar1 = key1[1];
        if (uVar1 != 0) {
          puVar4 = key1 + 2;
          do {
            __n = (RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher> *)
                  ((ulong)uVar1 + ((ulong)__n >> 0x18) + (long)__n * 0x26);
            uVar1 = *puVar4;
            puVar4 = puVar4 + 1;
          } while (uVar1 != 0);
        }
        __buf = (void *)((ulong)__n % objToStore->fHashModulus);
      }
      for (pRVar5 = objToStore->fBucketList[(long)__buf];
          pRVar5 != (RefHashTableBucketElem<xercesc_4_0::XMLAttDef> *)0x0; pRVar5 = pRVar5->fNext) {
        bVar2 = StringHasher::equals((StringHasher *)&objToStore->field_0x30,key1,pRVar5->fKey);
        __buf = extraout_RDX;
        if (bVar2) goto LAB_002d4626;
      }
      pRVar5 = (RefHashTableBucketElem<xercesc_4_0::XMLAttDef> *)0x0;
LAB_002d4626:
      if (pRVar5 == (RefHashTableBucketElem<xercesc_4_0::XMLAttDef> *)0x0) {
        __fd = 0;
      }
      else {
        __fd = (int)pRVar5->fData;
      }
      XSerializeEngine::write(serEng,__fd,__buf,(size_t)__n);
    }
    RefHashTableOfEnumerator<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher>::
    ~RefHashTableOfEnumerator(&local_60);
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(RefHashTableOf<XMLAttDef>* const objToStore
                                    , XSerializeEngine&                serEng)
{
    if (serEng.needToStoreObject(objToStore))
    {
        serEng.writeSize (objToStore->getHashModulus());

        RefHashTableOfEnumerator<XMLAttDef> e(objToStore, false, objToStore->getMemoryManager());
        XMLSize_t itemNumber = 0;

        while (e.hasMoreElements())
        {
            e.nextElement();
            itemNumber++;
        }

        serEng.writeSize (itemNumber);
        e.Reset();

#ifdef XERCES_DEBUG_SORT_GRAMMAR
        //to sort the key
        SORT_KEYSET_ONEKEY(serEng.getMemoryManager())

        //to store the data
        for (XMLSize_t i=0; i < itemNumber; i++)
        {
            GET_NEXT_KEYSET()

            XMLAttDef* data = objToStore->get(strKey);
            serEng<<data;
        }
#else
        while (e.hasMoreElements())
        {
            XMLAttDef* data = objToStore->get(e.nextElementKey());
            serEng<<data;
        }
#endif
    }
}